

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O1

string * __thiscall
FastPForLib::CompositeCodec<FastPForLib::FastBinaryPacking<32u>,FastPForLib::VariableByte>::
name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  string local_38;
  
  FastBinaryPacking<32u>::name_abi_cxx11_(&local_38,(void *)((long)this + 8));
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_68 = *puVar5;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar5;
    local_78 = (ulong *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_48 = 0x656c626169726156;
  local_40 = 0x65747942;
  local_50 = 0xc;
  local_3c = 0;
  uVar6 = 0xf;
  if (local_78 != &local_68) {
    uVar6 = local_68;
  }
  local_58 = &local_48;
  if ((local_70 + 0xcU < 0x10) && (uVar6 < local_70 + 0xcU)) {
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
  }
  else {
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)&local_48);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return codec1.name() + "+" + codec2.name();
  }